

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O2

void __thiscall
Function_Pool::OutputInfo::_getArray
          (OutputInfo *this,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *input,vector<unsigned_int,_std::allocator<unsigned_int>_> *output)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  pointer pvVar1;
  pointer pvVar2;
  pointer puVar3;
  pointer puVar4;
  bool bVar5;
  imageException *this_00;
  ulong uVar6;
  pointer puVar7;
  pointer puVar8;
  
  __x = (input->
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  if (__x == (input->
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException(this_00,"Output array is empty");
  }
  else {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(output,__x);
    bVar5 = std::
            any_of<__gnu_cxx::__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>*,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>>,Function_Pool::OutputInfo::_getArray(std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>&,std::vector<unsigned_int,std::allocator<unsigned_int>>&)const::_lambda(std::vector<unsigned_int,std::allocator<unsigned_int>>&)_1_>
                      ((input->
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,
                       (input->
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish,
                       (anon_class_8_1_65350a3f_for__M_pred)output);
    if (!bVar5) {
      pvVar1 = (input->
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pvVar2 = (input->
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      puVar3 = (output->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar6 = 1; uVar6 < (ulong)(((long)pvVar2 - (long)pvVar1) / 0x18); uVar6 = uVar6 + 1) {
        puVar4 = *(pointer *)
                  ((long)&pvVar1[uVar6].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data + 8);
        puVar8 = puVar3;
        for (puVar7 = pvVar1[uVar6].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start; puVar7 != puVar4;
            puVar7 = puVar7 + 1) {
          *puVar8 = *puVar8 + *puVar7;
          puVar8 = puVar8 + 1;
        }
      }
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::clear(input);
      return;
    }
    this_00 = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException(this_00,"Returned histograms are not the same size");
  }
  __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void _getArray( std::vector < std::vector < uint32_t > > & input, std::vector < uint32_t > & output ) const
        {
            if( input.empty() )
                throw imageException( "Output array is empty" );

            output = input.front();

            if( std::any_of( input.begin(), input.end(), [&output]( std::vector <uint32_t> & v ) { return v.size() != output.size(); } ) )
                throw imageException( "Returned histograms are not the same size" );

            for( size_t i = 1; i < input.size(); ++i ) {
                std::vector < uint32_t >::iterator       out = output.begin();
                std::vector < uint32_t >::const_iterator in  = input[i].begin();
                std::vector < uint32_t >::const_iterator end = input[i].end();

                for( ; in != end; ++in, ++out )
                    *out += *in;
            }

            input.clear(); // to guarantee that no one can use it second time
        }